

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::
ColorSwatchTextRegBits<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
          (_anonymous_namespace_ *this,Emulator *e,u8 v,PaletteRGBA pal_rgba,int color_index,
          DmgSwatchArg args,DmgSwatchArg args_1)

{
  DmgSwatchArg arg;
  ImDrawList *this_00;
  int in_register_0000008c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 p;
  float sz;
  RGBA color_rgba;
  u8 color;
  int color_index_local;
  u8 v_local;
  Emulator *e_local;
  DmgSwatchArg args_local;
  PaletteRGBA pal_rgba_local;
  
  arg.color_index = in_register_0000008c;
  arg.pal = color_index;
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%d:",(ulong)pal_rgba.color[2]);
  color_rgba._0_1_ = (char)pal_rgba.color[2];
  p.y = (float)pal_rgba_local.color[(ulong)((byte)e >> ((char)color_rgba * '\x02' & 0x1fU) & 3) - 2]
  ;
  p.x = ImGui::GetTextLineHeight();
  ImGui::SameLine(0.0,-1.0);
  local_44 = ImGui::GetCursorScreenPos();
  this_00 = ImGui::GetWindowDrawList();
  ImVec2::ImVec2(&local_4c,local_44.x + p.x,local_44.y + p.x);
  ImDrawList::AddRectFilled(this_00,&local_44,&local_4c,(ImU32)p.y,0.0,0);
  ImVec2::ImVec2(&local_54,p.x,p.x);
  ImGui::Dummy(&local_54);
  anon_unknown.dwarf_71760::TextRegBits<(anonymous_namespace)::DmgSwatchArg>
            ((Emulator *)this,(byte)e,arg,args);
  return;
}

Assistant:

void ColorSwatchTextRegBits(Emulator* e, u8 v, PaletteRGBA pal_rgba,
                            int color_index, Args... args) {
  ImGui::SameLine();
  ImGui::Text("%d:", color_index);
  u8 color = (v >> (color_index * 2)) & 3;
  RGBA color_rgba = pal_rgba.color[color];
  float sz = ImGui::GetTextLineHeight();
  ImGui::SameLine();
  ImVec2 p = ImGui::GetCursorScreenPos();
  ImGui::GetWindowDrawList()->AddRectFilled(p, ImVec2(p.x + sz, p.y + sz),
                                            color_rgba);
  ImGui::Dummy(ImVec2(sz, sz));
  TextRegBits(e, v, args...);
}